

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

PackageSymbol * __thiscall
slang::ast::findPackage
          (ast *this,string_view packageName,Scope *lookupScope,SourceLocation errorLoc,
          bool isFromExport)

{
  Compilation *this_00;
  PackageSymbol *pPVar1;
  PackageSymbol *pPVar2;
  Diagnostic *this_01;
  Scope *this_02;
  DiagCode code;
  Scope *currScope;
  Scope *pSVar3;
  string_view lookupName;
  string_view arg;
  
  this_02 = (Scope *)packageName._M_str;
  this_00 = this_02->compilation;
  lookupName._M_str = (char *)packageName._M_len;
  lookupName._M_len = (size_t)this;
  pPVar2 = Compilation::getPackage(this_00,lookupName);
  pSVar3 = this_02;
  if (pPVar2 == (PackageSymbol *)0x0) {
    if ((this != (ast *)0x0) && (((this_00->options).flags.m_bits & 0x40) == 0)) {
      this_01 = Scope::addDiag(this_02,(DiagCode)0xd00006,(SourceLocation)lookupScope);
      arg._M_str = (char *)packageName._M_len;
      arg._M_len = (size_t)this;
      Diagnostic::operator<<(this_01,arg);
    }
  }
  else {
    do {
      pPVar1 = (PackageSymbol *)pSVar3->thisSym;
      if (pPVar2 == pPVar1) {
        if (errorLoc._0_1_ == '\0') {
          code.subsystem = Declarations;
          code.code = 0x94;
        }
        else {
          code.subsystem = Declarations;
          code.code = 0x93;
        }
        Scope::addDiag(this_02,code,(SourceLocation)lookupScope);
      }
      else {
        pSVar3 = (pPVar1->super_Symbol).parentScope;
      }
      if (pPVar2 == pPVar1) {
        return (PackageSymbol *)0x0;
      }
    } while (pSVar3 != (Scope *)0x0);
  }
  return pPVar2;
}

Assistant:

static const PackageSymbol* findPackage(std::string_view packageName, const Scope& lookupScope,
                                        SourceLocation errorLoc, bool isFromExport) {
    auto& comp = lookupScope.getCompilation();
    auto package = comp.getPackage(packageName);
    if (!package) {
        if (!packageName.empty() && !comp.hasFlag(CompilationFlags::LintMode))
            lookupScope.addDiag(diag::UnknownPackage, errorLoc) << packageName;
    }
    else {
        // Make sure we aren't trying to import/export our own package.
        auto currScope = &lookupScope;
        do {
            auto& sym = currScope->asSymbol();
            if (package == &sym) {
                if (isFromExport)
                    lookupScope.addDiag(diag::PackageExportSelf, errorLoc);
                else
                    lookupScope.addDiag(diag::PackageImportSelf, errorLoc);
                return nullptr;
            }

            currScope = sym.getParentScope();
        } while (currScope);
    }

    return package;
}